

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int prvTidyParseConfigFileEnc(TidyDocImpl *doc,ctmbstr file,ctmbstr charenc)

{
  TidyConfigImpl *config;
  int encoding;
  tchar tVar1;
  Bool BVar2;
  tchar c;
  uint uVar3;
  ctmbstr __filename;
  FILE *fp;
  StreamIn *pSVar4;
  TidyOptionImpl *pTVar5;
  TidyConfigCallback p_Var6;
  tchar tVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  tmbchar name [64];
  tmbchar buf [8192];
  
  uVar3 = doc->optionErrors;
  __filename = ExpandTilde(doc,file);
  fp = fopen(__filename,"r");
  encoding = prvTidyGetCharEncodingFromOptName(charenc);
  if (encoding < 0 || fp == (FILE *)0x0) {
    prvTidyReportFileError(doc,__filename,0x23e);
    uVar3 = 0xffffffff;
  }
  else {
    config = &doc->config;
    pSVar4 = prvTidyFileInput(doc,(FILE *)fp,encoding);
    (doc->config).cfgIn = pSVar4;
    tVar1 = GetC(config);
    (doc->config).c = tVar1;
    tVar1 = SkipWhite(config);
    while (tVar1 != 0xffffffff) {
      name[0x30] = '\0';
      name[0x31] = '\0';
      name[0x32] = '\0';
      name[0x33] = '\0';
      name[0x34] = '\0';
      name[0x35] = '\0';
      name[0x36] = '\0';
      name[0x37] = '\0';
      name[0x38] = '\0';
      name[0x39] = '\0';
      name[0x3a] = '\0';
      name[0x3b] = '\0';
      name[0x3c] = '\0';
      name[0x3d] = '\0';
      name[0x3e] = '\0';
      name[0x3f] = '\0';
      name[0x20] = '\0';
      name[0x21] = '\0';
      name[0x22] = '\0';
      name[0x23] = '\0';
      name[0x24] = '\0';
      name[0x25] = '\0';
      name[0x26] = '\0';
      name[0x27] = '\0';
      name[0x28] = '\0';
      name[0x29] = '\0';
      name[0x2a] = '\0';
      name[0x2b] = '\0';
      name[0x2c] = '\0';
      name[0x2d] = '\0';
      name[0x2e] = '\0';
      name[0x2f] = '\0';
      name[0x10] = '\0';
      name[0x11] = '\0';
      name[0x12] = '\0';
      name[0x13] = '\0';
      name[0x14] = '\0';
      name[0x15] = '\0';
      name[0x16] = '\0';
      name[0x17] = '\0';
      name[0x18] = '\0';
      name[0x19] = '\0';
      name[0x1a] = '\0';
      name[0x1b] = '\0';
      name[0x1c] = '\0';
      name[0x1d] = '\0';
      name[0x1e] = '\0';
      name[0x1f] = '\0';
      name[0] = '\0';
      name[1] = '\0';
      name[2] = '\0';
      name[3] = '\0';
      name[4] = '\0';
      name[5] = '\0';
      name[6] = '\0';
      name[7] = '\0';
      name[8] = '\0';
      name[9] = '\0';
      name[10] = '\0';
      name[0xb] = '\0';
      name[0xc] = '\0';
      name[0xd] = '\0';
      name[0xe] = '\0';
      name[0xf] = '\0';
      if ((tVar1 != 0x23) && (tVar1 != 0x2f)) {
        for (lVar9 = 0; lVar9 != 0x3f; lVar9 = lVar9 + 1) {
          if ((tVar1 == 0xffffffff) || (tVar1 == 10)) goto LAB_0014b77e;
          if (tVar1 == 0x3a) goto LAB_0014b807;
          name[lVar9] = (tmbchar)tVar1;
          tVar1 = AdvanceChar(config);
        }
        if (tVar1 == 0x3a) {
LAB_0014b807:
          pTVar5 = prvTidylookupOption(name);
          AdvanceChar(config);
          if (pTVar5 == (TidyOptionImpl *)0x0) {
            if ((doc->pOptCallback != (TidyOptCallback)0x0) ||
               (doc->pConfigCallback != (TidyConfigCallback)0x0)) {
              tVar1 = SkipWhite(config);
              if ((tVar1 == 0x27) || (tVar7 = 0, c = tVar1, tVar1 == 0x22)) {
                c = AdvanceChar(config);
                tVar7 = tVar1;
              }
              bVar8 = false;
              for (uVar10 = 0; uVar10 != 0x1ffe; uVar10 = uVar10 + 1) {
                while( true ) {
                  if (((c + 1 < 0xf) && ((0x4801U >> (c + 1 & 0x1f) & 1) != 0)) ||
                     (tVar7 != 0 && c == tVar7)) {
                    uVar10 = uVar10 & 0xffffffff;
                    goto LAB_0014b8db;
                  }
                  BVar2 = prvTidyIsWhite(c);
                  if (BVar2 == no) goto LAB_0014b8c1;
                  if (bVar8) break;
                  c = AdvanceChar(config);
                  bVar8 = false;
                }
                c = 0x20;
LAB_0014b8c1:
                buf[uVar10] = (tmbchar)c;
                c = AdvanceChar(config);
                bVar8 = true;
              }
              uVar10 = 0x1ffe;
LAB_0014b8db:
              buf[uVar10] = '\0';
              if (doc->pOptCallback == (TidyOptCallback)0x0) {
                p_Var6 = doc->pConfigCallback;
                if (p_Var6 != (TidyConfigCallback)0x0) goto LAB_0014b922;
              }
              else {
                BVar2 = (*doc->pOptCallback)(name,buf);
                p_Var6 = doc->pConfigCallback;
                if (p_Var6 != (TidyConfigCallback)0x0) {
                  if (BVar2 != no) goto LAB_0014b77e;
LAB_0014b922:
                  BVar2 = (*p_Var6)((TidyDoc)doc,name,buf);
                  BVar2 = (Bool)(BVar2 != no);
                }
                if (BVar2 != no) goto LAB_0014b77e;
              }
            }
            prvTidyReportUnknownOption(doc,name);
          }
          else {
            (*pTVar5->parser)(doc,pTVar5);
          }
        }
      }
LAB_0014b77e:
      do {
        tVar1 = (doc->config).c;
        while( true ) {
          if ((tVar1 == 0xffffffff) || (tVar1 == 10)) goto LAB_0014b7ae;
          if (tVar1 == 0xd) break;
          tVar1 = GetC(config);
          (doc->config).c = tVar1;
        }
        tVar1 = GetC(config);
        (doc->config).c = tVar1;
LAB_0014b7ae:
        if (tVar1 == 10) {
          tVar1 = GetC(config);
          (doc->config).c = tVar1;
        }
        BVar2 = prvTidyIsWhite(tVar1);
      } while (BVar2 != no);
      tVar1 = (doc->config).c;
    }
    prvTidyfreeFileSource(&((doc->config).cfgIn)->source,yes);
    prvTidyfreeStreamIn((doc->config).cfgIn);
    (doc->config).cfgIn = (StreamIn *)0x0;
    if (__filename != file) {
      (*doc->allocator->vtbl->free)(doc->allocator,__filename);
    }
    uVar3 = (uint)(uVar3 < doc->optionErrors);
  }
  return uVar3;
}

Assistant:

int TY_(ParseConfigFileEnc)( TidyDocImpl* doc, ctmbstr file, ctmbstr charenc )
{
    enum { tidy_max_name = 64 };
    uint opterrs = doc->optionErrors;
    tmbstr fname = (tmbstr) ExpandTilde( doc, file );
    TidyConfigImpl* cfg = &doc->config;
    FILE* fin = fopen( fname, "r" );
    int enc = TY_(CharEncodingId)( doc, charenc );

    if ( fin == NULL || enc < 0 )
    {
        TY_(ReportFileError)( doc, fname, FILE_CANT_OPEN_CFG );
        return -1;
    }
    else
    {
        tchar c;
        cfg->cfgIn = TY_(FileInput)( doc, fin, enc );
        c = FirstChar( cfg );
       
        for ( c = SkipWhite(cfg); c != EndOfStream; c = NextProperty(cfg) )
        {
            uint ix = 0;
            tmbchar name[ tidy_max_name ] = {0};

            /* // or # start a comment */
            if ( c == '/' || c == '#' )
                continue;

            while ( ix < sizeof(name)-1 && c != '\n' && c != EndOfStream && c != ':' )
            {
                name[ ix++ ] = (tmbchar) c;  /* Option names all ASCII */
                c = AdvanceChar( cfg );
            }

            if ( c == ':' )
            {
                Bool isDeprecated = isOptionDeprecated( name );
                const TidyOptionImpl* option = TY_(lookupOption)( name );
                c = AdvanceChar( cfg );
                if ( option && !isDeprecated )
                    option->parser( doc, option );
                else
                {
                    if ( (NULL != doc->pOptCallback) || (NULL != doc->pConfigCallback) || isDeprecated )
                    {
                        TidyConfigImpl* cfg = &doc->config;
                        tmbchar buf[8192];
                        uint i = 0;
                        tchar delim = 0;
                        Bool waswhite = yes;
                        Bool response = no;

                        tchar c = SkipWhite( cfg );

                        if ( c == '"' || c == '\'' )
                        {
                            delim = c;
                            c = AdvanceChar( cfg );
                        }

                        while ( i < sizeof(buf)-2 && c != EndOfStream && c != '\r' && c != '\n' )
                        {
                            if ( delim && c == delim )
                                break;

                            if ( TY_(IsWhite)(c) )
                            {
                                if ( waswhite )
                                {
                                    c = AdvanceChar( cfg );
                                    continue;
                                }
                                c = ' ';
                            }
                            else
                                waswhite = no;

                            buf[i++] = (tmbchar) c;
                            c = AdvanceChar( cfg );
                        }
                        buf[i] = '\0';
                        
                        if ( doc->pOptCallback )
                            response = (*doc->pOptCallback)( name, buf );

                        if ( doc->pConfigCallback )
                            response = response || (*doc->pConfigCallback)( tidyImplToDoc(doc), name, buf );

                        if ( !response && isDeprecated )
                            response = subDeprecatedOption( doc, name, buf);

                        if ( response == no )
                            TY_(ReportUnknownOption)( doc, name );
                    }
                    else
                        TY_(ReportUnknownOption)( doc, name );
                }
            }
        }

        TY_(freeFileSource)(&cfg->cfgIn->source, yes);
        TY_(freeStreamIn)( cfg->cfgIn );
        cfg->cfgIn = NULL;
    }

    if ( fname != (tmbstr) file )
        TidyDocFree( doc, fname );

    /* @jsd: do NOT mess with user-specified settings until
     *       absolutely necessary, and ensure that we can
     *       can restore them immediately after the need.
     */
    // TY_(AdjustConfig)( docTo );  /* Make sure it's consistent */

    /* any new config errors? If so, return warning status. */
    return (doc->optionErrors > opterrs ? 1 : 0); 
}